

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O2

void __thiscall
btKinematicCharacterController::playerStep
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld,btScalar dt)

{
  int *piVar1;
  float fVar2;
  btPairCachingGhostObject *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  float fVar7;
  btVector3 bVar8;
  btScalar dtMoving;
  btVector3 move;
  btVector3 platformHorizontalStep;
  btScalar local_c0;
  float local_bc;
  btScalar local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  btVector3 local_88;
  btVector3 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_c0 = dt;
  local_b8 = dt;
  iVar6 = (*(this->super_btCharacterControllerInterface).super_btActionInterface.
            _vptr_btActionInterface[0xc])();
  this->m_wasOnGround = SUB41(iVar6,0);
  getUpAxisDirections();
  local_98 = *(undefined8 *)getUpAxisDirections::sUpAxisDirection[this->m_upAxis].m_floats;
  fStack_b4 = (float)((ulong)local_98 >> 0x20);
  local_bc = getUpAxisDirections::sUpAxisDirection[this->m_upAxis].m_floats[2];
  fVar7 = (this->m_walkDirection).m_floats[2] * local_bc +
          (this->m_walkDirection).m_floats[0] * (float)local_98 +
          (this->m_walkDirection).m_floats[1] * fStack_b4 +
          (this->m_verticalVelocity - local_b8 * this->m_gravity);
  this->m_verticalVelocity = fVar7;
  if ((0.0 < fVar7) && (fVar2 = this->m_jumpSpeed, fVar2 < fVar7)) {
    this->m_verticalVelocity = fVar2;
    fVar7 = fVar2;
  }
  uStack_90 = 0;
  if ((fVar7 < 0.0) && (ABS(this->m_fallSpeed) < ABS(fVar7))) {
    this->m_verticalVelocity = -ABS(this->m_fallSpeed);
  }
  local_b8 = fStack_b4;
  fStack_b0 = fStack_b4;
  fStack_ac = fStack_b4;
  bVar8 = operator*(&this->m_platformLinearVelocity,&local_c0);
  fVar7 = local_bc * bVar8.m_floats[2] +
          (float)local_98 * bVar8.m_floats[0] + local_98._4_4_ * bVar8.m_floats[1];
  local_78.m_floats[1] = bVar8.m_floats[1] - fVar7 * local_98._4_4_;
  local_78.m_floats[0] = bVar8.m_floats[0] - fVar7 * (float)local_98;
  local_78.m_floats[2] = bVar8.m_floats[2] - local_bc * fVar7;
  local_78.m_floats[3] = 0.0;
  this->m_verticalOffset = this->m_verticalVelocity * local_c0 + fVar7;
  pbVar3 = this->m_ghostObject;
  local_68 = *(undefined8 *)
              (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[0]
              .m_floats;
  uStack_60 = *(undefined8 *)
               ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el
                [0].m_floats + 2);
  local_58 = *(undefined8 *)
              (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[1]
              .m_floats;
  uStack_50 = *(undefined8 *)
               ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el
                [1].m_floats + 2);
  local_48 = *(undefined8 *)
              (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[2]
              .m_floats;
  uStack_40 = *(undefined8 *)
               ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el
                [2].m_floats + 2);
  stepUp(this,collisionWorld);
  if (this->m_useWalkDirection == true) {
    bVar8 = operator+(&local_78,&this->m_walkDirection);
    fVar7 = (this->m_walkDirection).m_floats[2] * local_bc +
            (this->m_walkDirection).m_floats[0] * (float)local_98 +
            local_b8 * (this->m_walkDirection).m_floats[1];
    local_88.m_floats[0] = bVar8.m_floats[0] - (float)local_98 * fVar7;
    local_88.m_floats[1] = bVar8.m_floats[1] - local_98._4_4_ * fVar7;
    local_88.m_floats[2] = bVar8.m_floats[2] - local_bc * fVar7;
    local_88.m_floats[3] = 0.0;
  }
  else {
    fVar7 = this->m_velocityTimeInterval;
    local_9c = local_c0;
    if (fVar7 <= local_c0) {
      local_9c = fVar7;
    }
    this->m_velocityTimeInterval = fVar7 - local_c0;
    bVar8 = operator*(&this->m_walkDirection,&local_9c);
    local_88.m_floats[0] = bVar8.m_floats[0];
    local_88.m_floats[1] = bVar8.m_floats[1];
    local_88.m_floats[2] = bVar8.m_floats[2];
    local_88.m_floats[3] = bVar8.m_floats[3];
  }
  stepForwardAndStrafe(this,collisionWorld,&local_88);
  stepDown(this,collisionWorld,local_c0);
  uVar4 = *(undefined8 *)(this->m_currentPosition).m_floats;
  uVar5 = *(undefined8 *)((this->m_currentPosition).m_floats + 2);
  pbVar3 = this->m_ghostObject;
  piVar1 = &(pbVar3->super_btGhostObject).super_btCollisionObject.m_updateRevision;
  *piVar1 = *piVar1 + 1;
  *(undefined8 *)
   (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[0].m_floats =
       local_68;
  *(undefined8 *)
   ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[0].m_floats
   + 2) = uStack_60;
  *(undefined8 *)
   (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[1].m_floats =
       local_58;
  *(undefined8 *)
   ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[1].m_floats
   + 2) = uStack_50;
  *(undefined8 *)
   (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[2].m_floats =
       local_48;
  *(undefined8 *)
   ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[2].m_floats
   + 2) = uStack_40;
  *(undefined8 *)
   (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats = uVar4;
  *(undefined8 *)
   ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats + 2) =
       uVar5;
  return;
}

Assistant:

void btKinematicCharacterController::playerStep (  btCollisionWorld* collisionWorld, btScalar dt)
{
//	printf("playerStep(): ");
//	printf("  dt = %f", dt);

	// quick check...
	if (!m_useWalkDirection && !m_platformLinearVelocity && (m_velocityTimeInterval <= 0.0 || m_walkDirection.fuzzyZero())) {
//		printf("\n");
		return;		// no motion
	}

	m_wasOnGround = onGround();

	// Update fall velocity.
	auto upVector = getUpAxisDirections()[m_upAxis];
	m_verticalVelocity -= m_gravity * dt;
	m_verticalVelocity += upVector.dot(m_walkDirection);
	if(m_verticalVelocity > 0.0 && m_verticalVelocity > m_jumpSpeed)
	{
		m_verticalVelocity = m_jumpSpeed;
	}
	if(m_verticalVelocity < 0.0 && btFabs(m_verticalVelocity) > btFabs(m_fallSpeed))
	{
		m_verticalVelocity = -btFabs(m_fallSpeed);
	}

	//printf("m_platformLinearVelocity %f %f %f: %f\n", m_platformLinearVelocity.x(), m_platformLinearVelocity.y(), m_platformLinearVelocity.z(), dt);
	auto platformStep = m_platformLinearVelocity*dt;
	auto platformVerticalOffset = upVector.dot(platformStep);
	auto platformHorizontalStep = platformStep - platformVerticalOffset*upVector;
	m_verticalOffset = platformVerticalOffset + m_verticalVelocity * dt;

	btTransform xform;
	xform = m_ghostObject->getWorldTransform ();

	//printf("m_useWalkDirection %d walkDirection(%f,%f,%f)\n",m_useWalkDirection, m_walkDirection[0],m_walkDirection[1],m_walkDirection[2]);
	//printf("walkSpeed=%f\n",walkSpeed);

	stepUp (collisionWorld);
	if (m_useWalkDirection) {
		stepForwardAndStrafe (collisionWorld, platformHorizontalStep + m_walkDirection - upVector.dot(m_walkDirection)*upVector);
	} else {
		//printf("  time: %f", m_velocityTimeInterval);
		// still have some time left for moving!
		btScalar dtMoving =
			(dt < m_velocityTimeInterval) ? dt : m_velocityTimeInterval;
		m_velocityTimeInterval -= dt;

		// how far will we move while we are moving?
		btVector3 move = m_walkDirection * dtMoving;

		//printf("  dtMoving: %f", dtMoving);

		// okay, step
		stepForwardAndStrafe(collisionWorld, move);
	}
	stepDown (collisionWorld, dt);

	// printf("\n");

	xform.setOrigin (m_currentPosition);
	m_ghostObject->setWorldTransform (xform);
}